

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<char_const*const&,char_const(&)[2],int_const&,char_const(&)[12],kj::String_const&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],int *params_2,
          char (*params_3) [12],String *params_4,char (*params_5) [2])

{
  char **value;
  char (*pacVar1) [2];
  kj *this_00;
  char (*value_00) [12];
  String *value_01;
  int *value_02;
  String *params_5_00;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_14UL> local_70;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  String *local_38;
  String *params_local_4;
  char (*params_local_3) [12];
  int *params_local_2;
  char (*params_local_1) [2];
  char **params_local;
  
  params_5_00 = __return_storage_ptr__;
  local_38 = (String *)params_3;
  params_local_4 = (String *)params_2;
  params_local_3 = (char (*) [12])params_1;
  params_local_2 = (int *)params;
  params_local_1 = (char (*) [2])this;
  params_local = (char **)__return_storage_ptr__;
  value = fwd<char_const*const&>((char **)this);
  local_48 = toCharSequence<char_const*const&>(value);
  pacVar1 = ::const((char (*) [2])params_local_2);
  local_58 = toCharSequence<char_const(&)[2]>(pacVar1);
  this_00 = (kj *)fwd<int_const&>((int *)params_local_3);
  toCharSequence<int_const&>(&local_70,this_00,value_02);
  value_00 = ::const((char (*) [12])params_local_4);
  local_80 = toCharSequence<char_const(&)[12]>(value_00);
  value_01 = fwd<kj::String_const&>(local_38);
  local_90 = toCharSequence<kj::String_const&>(value_01);
  pacVar1 = ::const((char (*) [2])params_4);
  local_a0 = toCharSequence<char_const(&)[2]>(pacVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_5_00,(_ *)&local_48,&local_58,(ArrayPtr<const_char> *)&local_70,
             (CappedArray<char,_14UL> *)&local_80,&local_90,&local_a0,
             (ArrayPtr<const_char> *)params_5_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}